

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintUInt32_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,uint32_t val)

{
  undefined1 local_48 [8];
  StringBaseTextGenerator generator;
  uint32_t val_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._12_4_ = val;
  anon_unknown_14::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  FastFieldValuePrinter::PrintUInt32
            (&this->delegate_,generator.output_.field_2._12_4_,(BaseTextGenerator *)local_48);
  protobuf::(anonymous_namespace)::StringBaseTextGenerator::Consume_abi_cxx11_
            (__return_storage_ptr__,local_48);
  anon_unknown_14::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintUInt32(uint32_t val) const {
  FORWARD_IMPL(PrintUInt32, val);
}